

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  xmlCharEncodingHandlerPtr handler_local;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if ((handler == (xmlCharEncodingHandlerPtr)0x0) || (handlers == (xmlCharEncodingHandlerPtr *)0x0))
  {
    xmlEncodingErr(XML_I18N_NO_HANDLER,"xmlRegisterCharEncodingHandler: NULL handler !\n",
                   (char *)0x0);
  }
  else {
    if (nbCharEncodingHandler < 0x32) {
      lVar1 = (long)nbCharEncodingHandler;
      nbCharEncodingHandler = nbCharEncodingHandler + 1;
      handlers[lVar1] = handler;
      return;
    }
    xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
                   "xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
                   "MAX_ENCODING_HANDLERS");
  }
  if (handler != (xmlCharEncodingHandlerPtr)0x0) {
    if (handler->name != (char *)0x0) {
      (*xmlFree)(handler->name);
    }
    (*xmlFree)(handler);
  }
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if ((handler == NULL) || (handlers == NULL)) {
        xmlEncodingErr(XML_I18N_NO_HANDLER,
		"xmlRegisterCharEncodingHandler: NULL handler !\n", NULL);
        goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS) {
        xmlEncodingErr(XML_I18N_EXCESS_HANDLER,
	"xmlRegisterCharEncodingHandler: Too many handler registered, see %s\n",
	               "MAX_ENCODING_HANDLERS");
        goto free_handler;
    }
    handlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}